

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

uint16_t __thiscall CPU::ReadWord(CPU *this,uint16_t address)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint16_t address_local;
  CPU *this_local;
  
  uVar1 = ReadByte(this,address);
  uVar2 = ReadByte(this,address + 1);
  return CONCAT11(uVar2,uVar1);
}

Assistant:

uint16_t CPU::ReadWord(uint16_t address)
{
    return (uint16_t)(ReadByte(address) | (ReadByte(address + 1) << 8));
}